

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

void mod2sparse_transpose(mod2sparse *m,mod2sparse *r)

{
  byte *pbVar1;
  int col;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  mod2entry *pmVar7;
  mod2sparse *r_00;
  mod2sparse *r_01;
  void *__s;
  mod2entry *pmVar8;
  long lVar9;
  long lVar10;
  
  if ((m->n_rows == r->n_cols) && (m->n_cols == r->n_rows)) {
    if (r != m) {
      mod2sparse_clear(r);
      iVar4 = m->n_rows;
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          pmVar7 = m->rows[lVar10].right;
          if (-1 < pmVar7->row) {
            do {
              mod2sparse_insert(r,pmVar7->col,(int)lVar10);
              pmVar7 = pmVar7->right;
            } while (-1 < pmVar7->row);
            iVar4 = m->n_rows;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar4);
      }
      return;
    }
  }
  else {
    mod2sparse_transpose_cold_1();
  }
  mod2sparse_transpose_cold_2();
  if ((((m->n_rows == r_00->n_rows) && (m->n_cols == r_00->n_cols)) && (r->n_rows == m->n_rows)) &&
     (r->n_cols == m->n_cols)) {
    if ((r_00 != m) && (r_00 != r)) {
      mod2sparse_clear(r_00);
      if (r_00->n_rows < 1) {
        return;
      }
      lVar10 = 0;
LAB_00121cf6:
      pmVar7 = m->rows[lVar10].right;
      pmVar8 = r->rows[lVar10].right;
      while (iVar4 = (int)lVar10, -1 < pmVar7->row) {
        if (pmVar8->row < 0) goto LAB_00121d4a;
        iVar5 = pmVar7->col;
        col = pmVar8->col;
        if (iVar5 == col) {
          pmVar7 = pmVar7->right;
LAB_00121d44:
          pmVar8 = pmVar8->right;
        }
        else {
          if (col <= iVar5) {
            mod2sparse_insert(r_00,iVar4,col);
            goto LAB_00121d44;
          }
          mod2sparse_insert(r_00,iVar4,iVar5);
          pmVar7 = pmVar7->right;
        }
      }
      goto LAB_00121d77;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((m->n_cols == r->n_rows) && (m->n_rows == r_01->n_rows)) && (r->n_cols == r_01->n_cols)) {
    if ((r_01 != m) && (r_01 != r)) {
      mod2sparse_clear(r_01);
      iVar4 = m->n_rows;
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          if ((-1 < (m->rows[lVar10].right)->row) && (iVar5 = r->n_cols, 0 < iVar5)) {
            lVar9 = 0;
            do {
              pmVar7 = m->rows[lVar10].right;
              if (-1 < pmVar7->row) {
                pmVar8 = r->cols[lVar9].down;
                bVar3 = false;
                do {
                  iVar4 = pmVar8->row;
                  if (iVar4 < 0) break;
                  if (pmVar7->col == iVar4) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar7 = pmVar7->right;
LAB_00121e59:
                    pmVar8 = pmVar8->down;
                  }
                  else {
                    if (iVar4 <= pmVar7->col) goto LAB_00121e59;
                    pmVar7 = pmVar7->right;
                  }
                } while (-1 < pmVar7->row);
                if (bVar3) {
                  mod2sparse_insert(r_01,(int)lVar10,(int)lVar9);
                  iVar5 = r->n_cols;
                }
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar5);
            iVar4 = m->n_rows;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar4);
      }
      return;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = m->n_cols;
  if (0 < (long)m->n_rows) {
    memset(__s,0,(long)m->n_rows);
  }
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      if (*(char *)((long)&r->n_rows + uVar6) != '\0') {
        for (pmVar7 = m->cols[uVar6].down; -1 < pmVar7->row; pmVar7 = pmVar7->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar7->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  return;
LAB_00121d4a:
  do {
    mod2sparse_insert(r_00,iVar4,pmVar7->col);
    pmVar7 = pmVar7->right;
  } while (-1 < pmVar7->row);
LAB_00121d77:
  for (; -1 < pmVar8->row; pmVar8 = pmVar8->right) {
    mod2sparse_insert(r_00,iVar4,pmVar8->col);
  }
  lVar10 = lVar10 + 1;
  if (r_00->n_rows <= lVar10) {
    return;
  }
  goto LAB_00121cf6;
}

Assistant:

void mod2sparse_transpose
( mod2sparse *m,	/* Matrix to compute transpose of (left unchanged) */
  mod2sparse *r		/* Result of transpose operation */
)
{
  mod2entry *e;
  int i;

  if (mod2sparse_rows(m)!=mod2sparse_cols(r) 
   || mod2sparse_cols(m)!=mod2sparse_rows(r))
  { fprintf(stderr,
     "mod2sparse_transpose: Matrices have incompatible dimensions\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
     "mod2sparse_transpose: Result matrix is the same as the operand\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(m); i++)
  {
    e = mod2sparse_first_in_row(m,i);

    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,mod2sparse_col(e),i);
      e = mod2sparse_next_in_row(e);
    }
  }
}